

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateSerializeWithCachedSizesBody
          (MessageGenerator *this,Printer *printer,bool to_array)

{
  int iVar1;
  Descriptor *pDVar2;
  bool to_array_00;
  undefined8 uVar3;
  Descriptor *pDVar4;
  ulong uVar5;
  FieldDescriptor **ppFVar6;
  undefined7 in_register_00000011;
  int iVar7;
  long lVar8;
  char *text;
  MessageGenerator *pMVar9;
  MessageGenerator *pMVar10;
  __normal_iterator<const_google::protobuf::Descriptor::ExtensionRange_**,_std::vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>_>
  __i;
  MessageGenerator *pMVar11;
  long lVar12;
  scoped_array<const_google::protobuf::FieldDescriptor_*> ordered_fields;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  sorted_extensions;
  undefined1 local_68 [12];
  undefined4 local_5c;
  undefined1 local_58 [32];
  ExtensionRange *local_38;
  
  local_5c = (undefined4)CONCAT71(in_register_00000011,to_array);
  pMVar9 = (MessageGenerator *)this->descriptor_;
  local_68._0_8_ = anon_unknown_0::SortFieldsByNumber((Descriptor *)pMVar9);
  local_58._0_8_ = (MessageGenerator *)0x0;
  local_58._8_8_ = (MessageGenerator *)0x0;
  local_58._16_8_ = 0;
  pDVar4 = this->descriptor_;
  if (0 < *(int *)(pDVar4 + 0x58)) {
    lVar12 = 0;
    lVar8 = 0;
    do {
      local_38 = (ExtensionRange *)(*(long *)(pDVar4 + 0x60) + lVar12);
      pMVar9 = (MessageGenerator *)local_58;
      std::
      vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
      ::emplace_back<google::protobuf::Descriptor::ExtensionRange_const*>
                ((vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
                  *)local_58,&local_38);
      lVar8 = lVar8 + 1;
      pDVar4 = this->descriptor_;
      lVar12 = lVar12 + 8;
    } while (lVar8 < *(int *)(pDVar4 + 0x58));
  }
  uVar3 = local_58._8_8_;
  pMVar10 = (MessageGenerator *)local_58._0_8_;
  if (local_58._0_8_ != local_58._8_8_) {
    lVar12 = local_58._8_8_ - local_58._0_8_;
    uVar5 = lVar12 >> 3;
    lVar8 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cxx::(anonymous_namespace)::ExtensionRangeSorter>>
              (local_58._0_8_,local_58._8_8_,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar12 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cxx::(anonymous_namespace)::ExtensionRangeSorter>>
                (pMVar10,uVar3);
      pMVar9 = pMVar10;
    }
    else {
      pMVar11 = (MessageGenerator *)&pMVar10[1].classname_;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cxx::(anonymous_namespace)::ExtensionRangeSorter>>
                (pMVar10,pMVar11);
      for (; pMVar9 = pMVar10, pMVar11 != (MessageGenerator *)uVar3;
          pMVar11 = (MessageGenerator *)&pMVar11->classname_) {
        pDVar4 = (Descriptor *)pMVar11[-1].extension_generators_.array_;
        pDVar2 = pMVar11->descriptor_;
        iVar1 = *(int *)pDVar2;
        iVar7 = *(int *)&pDVar4->field_0x0;
        pMVar9 = pMVar11;
        while (iVar1 < iVar7) {
          pMVar9->descriptor_ = pDVar4;
          pDVar4 = (Descriptor *)pMVar9[-1].enum_generators_.array_;
          pMVar9 = (MessageGenerator *)&pMVar9[-1].extension_generators_;
          iVar7 = *(int *)&pDVar4->field_0x0;
        }
        pMVar9->descriptor_ = pDVar2;
      }
    }
  }
  iVar7 = 0;
  to_array_00 = (bool)(char)local_5c;
  uVar5 = 0;
LAB_001c36cc:
  lVar8 = (long)iVar7;
  uVar5 = (ulong)(int)uVar5;
  do {
    iVar1 = *(int *)(this->descriptor_ + 0x2c);
    if ((iVar1 <= iVar7) && ((ulong)((long)(local_58._8_8_ - local_58._0_8_) >> 3) <= uVar5)) {
      if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
        io::Printer::Print(printer,"if (!unknown_fields().empty()) {\n");
        io::Printer::Indent(printer);
        text = 
        "::google::protobuf::internal::WireFormat::SerializeUnknownFields(\n    unknown_fields(), output);\n"
        ;
        if ((char)local_5c != '\0') {
          text = 
          "target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(\n    unknown_fields(), target);\n"
          ;
        }
        io::Printer::Print(printer,text);
        io::Printer::Outdent(printer);
        io::Printer::Print(printer,"}\n");
      }
      if ((MessageGenerator *)local_58._0_8_ != (MessageGenerator *)0x0) {
        operator_delete((void *)local_58._0_8_,local_58._16_8_ - local_58._0_8_);
      }
      if ((FieldDescriptor **)local_68._0_8_ != (FieldDescriptor **)0x0) {
        operator_delete__((void *)local_68._0_8_);
      }
      return;
    }
    if (iVar7 == iVar1) {
      GenerateSerializeOneExtensionRange
                (pMVar9,printer,(ExtensionRange *)((Descriptor **)local_58._0_8_)[uVar5],to_array_00
                );
    }
    else {
      if (uVar5 == (long)(local_58._8_8_ - local_58._0_8_) >> 3) {
        ppFVar6 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                            ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)local_68,
                             lVar8);
        pMVar9 = this;
        GenerateSerializeOneField(this,printer,*ppFVar6,to_array_00);
        goto LAB_001c3783;
      }
      pMVar9 = (MessageGenerator *)local_68;
      ppFVar6 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                          ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)local_68,lVar8
                          );
      if (*(int *)(*ppFVar6 + 0x28) <
          ((ExtensionRange *)((Descriptor **)local_58._0_8_)[uVar5])->start) break;
      GenerateSerializeOneExtensionRange
                (pMVar9,printer,(ExtensionRange *)((Descriptor **)local_58._0_8_)[uVar5],to_array_00
                );
    }
    uVar5 = uVar5 + 1;
  } while( true );
  ppFVar6 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                      ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)local_68,lVar8);
  pMVar9 = this;
  GenerateSerializeOneField(this,printer,*ppFVar6,to_array_00);
LAB_001c3783:
  iVar7 = iVar7 + 1;
  goto LAB_001c36cc;
}

Assistant:

void MessageGenerator::
GenerateSerializeWithCachedSizesBody(io::Printer* printer, bool to_array) {
  scoped_array<const FieldDescriptor*> ordered_fields(
    SortFieldsByNumber(descriptor_));

  vector<const Descriptor::ExtensionRange*> sorted_extensions;
  for (int i = 0; i < descriptor_->extension_range_count(); ++i) {
    sorted_extensions.push_back(descriptor_->extension_range(i));
  }
  sort(sorted_extensions.begin(), sorted_extensions.end(),
       ExtensionRangeSorter());

  // Merge the fields and the extension ranges, both sorted by field number.
  int i, j;
  for (i = 0, j = 0;
       i < descriptor_->field_count() || j < sorted_extensions.size();
       ) {
    if (i == descriptor_->field_count()) {
      GenerateSerializeOneExtensionRange(printer,
                                         sorted_extensions[j++],
                                         to_array);
    } else if (j == sorted_extensions.size()) {
      GenerateSerializeOneField(printer, ordered_fields[i++], to_array);
    } else if (ordered_fields[i]->number() < sorted_extensions[j]->start) {
      GenerateSerializeOneField(printer, ordered_fields[i++], to_array);
    } else {
      GenerateSerializeOneExtensionRange(printer,
                                         sorted_extensions[j++],
                                         to_array);
    }
  }

  if (HasUnknownFields(descriptor_->file())) {
    printer->Print("if (!unknown_fields().empty()) {\n");
    printer->Indent();
    if (to_array) {
      printer->Print(
        "target = "
            "::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(\n"
        "    unknown_fields(), target);\n");
    } else {
      printer->Print(
        "::google::protobuf::internal::WireFormat::SerializeUnknownFields(\n"
        "    unknown_fields(), output);\n");
    }
    printer->Outdent();

    printer->Print(
      "}\n");
  }
}